

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall google::protobuf::io::CodedInputStream::Skip(CodedInputStream *this,int count)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  int bytes_until_limit;
  int closest_limit;
  int original_buffer_size;
  int count_local;
  CodedInputStream *this_local;
  
  if (count < 0) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = BufferSize(this);
    if (iVar1 < count) {
      if (this->buffer_size_after_limit_ < 1) {
        uVar2 = count - iVar1;
        this->buffer_ = (uint8 *)0x0;
        this->buffer_end_ = this->buffer_;
        piVar4 = std::min<int>(&this->current_limit_,&this->total_bytes_limit_);
        uVar3 = *piVar4 - this->total_bytes_read_;
        if ((int)uVar3 < (int)uVar2) {
          if (0 < (int)uVar3) {
            this->total_bytes_read_ = *piVar4;
            (*this->input_->_vptr_ZeroCopyInputStream[4])(this->input_,(ulong)uVar3);
          }
          this_local._7_1_ = false;
        }
        else {
          this->total_bytes_read_ = uVar2 + this->total_bytes_read_;
          iVar1 = (*this->input_->_vptr_ZeroCopyInputStream[4])(this->input_,(ulong)uVar2);
          this_local._7_1_ = (bool)((byte)iVar1 & 1);
        }
      }
      else {
        Advance(this,iVar1);
        this_local._7_1_ = false;
      }
    }
    else {
      Advance(this,count);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CodedInputStream::Skip(int count) {
  if (count < 0) return false;  // security: count is often user-supplied

  const int original_buffer_size = BufferSize();

  if (count <= original_buffer_size) {
    // Just skipping within the current buffer.  Easy.
    Advance(count);
    return true;
  }

  if (buffer_size_after_limit_ > 0) {
    // We hit a limit inside this buffer.  Advance to the limit and fail.
    Advance(original_buffer_size);
    return false;
  }

  count -= original_buffer_size;
  buffer_ = NULL;
  buffer_end_ = buffer_;

  // Make sure this skip doesn't try to skip past the current limit.
  int closest_limit = min(current_limit_, total_bytes_limit_);
  int bytes_until_limit = closest_limit - total_bytes_read_;
  if (bytes_until_limit < count) {
    // We hit the limit.  Skip up to it then fail.
    if (bytes_until_limit > 0) {
      total_bytes_read_ = closest_limit;
      input_->Skip(bytes_until_limit);
    }
    return false;
  }

  total_bytes_read_ += count;
  return input_->Skip(count);
}